

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
Execute<duckdb::string_t,double,duckdb::ArgMinMaxState<duckdb::string_t,double>>
          (ArgMinMaxBase<duckdb::LessThan,false> *this,
          ArgMinMaxState<duckdb::string_t,_double> *state,string_t x_data,double y_data,
          AggregateBinaryInput *binary)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ArgMinMaxBase<duckdb::LessThan,false> AVar4;
  string_t new_value;
  double local_30;
  
  uVar2 = x_data.value._8_8_;
  new_value.value._0_8_ = x_data.value._0_8_;
  uVar3 = uVar2;
  if ((**(long **)(uVar2 + 0x10) != 0) &&
     (uVar3 = *(ulong *)(uVar2 + 0x20),
     (*(ulong *)(**(long **)(uVar2 + 0x10) + (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) == 0)) {
    return;
  }
  local_30 = y_data;
  bVar1 = GreaterThan::Operation<double>((double *)(this + 0x18),&local_30);
  if (!bVar1) {
    return;
  }
  if (**(long **)(uVar2 + 8) == 0) {
    this[1] = (ArgMinMaxBase<duckdb::LessThan,false>)0x0;
  }
  else {
    uVar3 = *(ulong *)(uVar2 + 0x18);
    AVar4 = (ArgMinMaxBase<duckdb::LessThan,false>)
            ((*(ulong *)(**(long **)(uVar2 + 8) + (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) == 0);
    this[1] = AVar4;
    if ((bool)AVar4) goto LAB_00d9a7d8;
  }
  new_value.value.pointer.ptr = (char *)uVar3;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)(this + 8),(string_t *)state,new_value);
LAB_00d9a7d8:
  *(double *)(this + 0x18) = local_30;
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}